

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asm-functions.cpp
# Opt level: O2

size_t arangodb::velocypack::anon_unknown_0::JSONSkipWhiteSpaceC(uint8_t *src,size_t limit)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = 0;
  while (((src + sVar1 < src + limit && (uVar2 = (ulong)src[sVar1], uVar2 < 0x21)) &&
         ((0x100002600U >> (uVar2 & 0x3f) & 1) != 0))) {
    sVar1 = sVar1 + 1;
  }
  return sVar1;
}

Assistant:

inline std::size_t JSONSkipWhiteSpaceC(uint8_t const* src, std::size_t limit) {
  // Skip up to limit uint8_t from src as long as they are whitespace.
  // Advance ptr and return the number of skipped bytes.
  uint8_t const* end = src + limit;
  while (src < end &&
         (*src == ' ' || *src == '\t' || *src == '\n' || *src == '\r')) {
    src++;
  }
  return limit - (end - src);
}